

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O2

Fraig_HashTable_t * Fraig_HashTableCreate(int nSize)

{
  int iVar1;
  Fraig_HashTable_t *pFVar2;
  Fraig_Node_t **ppFVar3;
  
  pFVar2 = (Fraig_HashTable_t *)calloc(1,0x10);
  iVar1 = Abc_PrimeCudd(nSize);
  pFVar2->nBins = iVar1;
  ppFVar3 = (Fraig_Node_t **)calloc(1,(long)iVar1 << 3);
  pFVar2->pBins = ppFVar3;
  return pFVar2;
}

Assistant:

Fraig_HashTable_t * Fraig_HashTableCreate( int nSize )
{
    Fraig_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Fraig_HashTable_t, 1 );
    memset( p, 0, sizeof(Fraig_HashTable_t) );
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBins = ABC_ALLOC( Fraig_Node_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Fraig_Node_t *) * p->nBins );
    return p;
}